

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

void __thiscall
pybind11::exception<kratos::VarException>::exception
          (exception<kratos::VarException> *this,handle scope,char *name,handle base)

{
  bool bVar1;
  undefined8 uVar2;
  PyObject **ppPVar3;
  PyObject *pPVar4;
  bool local_1ba;
  str_attr_accessor local_198;
  allocator<char> local_171;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  byte local_109;
  str_attr_accessor local_108;
  PyObject *local_e8;
  allocator<char> local_d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  str_attr_accessor local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined1 local_48 [8];
  string full_name;
  char *name_local;
  exception<kratos::VarException> *this_local;
  handle base_local;
  handle scope_local;
  
  full_name.field_2._8_8_ = name;
  this_local = (exception<kratos::VarException> *)base.m_ptr;
  base_local = scope;
  object::object(&this->super_object);
  pybind11::detail::object_api<pybind11::handle>::attr
            (&local_a8,(object_api<pybind11::handle> *)&base_local,"__name__");
  pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>::
  cast<std::__cxx11::string>(&local_88,&local_a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,".",&local_d9);
  std::operator+(&local_68,&local_88,&local_d8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                 &local_68,(char *)full_name.field_2._8_8_);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator(&local_d9);
  std::__cxx11::string::~string((string *)&local_88);
  pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_a8);
  uVar2 = std::__cxx11::string::c_str();
  ppPVar3 = pybind11::handle::ptr((handle *)&this_local);
  pPVar4 = (PyObject *)PyErr_NewException(uVar2,*ppPVar3,0);
  (this->super_object).super_handle.m_ptr = pPVar4;
  local_e8 = base_local.m_ptr;
  local_109 = 0;
  bVar1 = hasattr(base_local,"__dict__");
  local_1ba = false;
  if (bVar1) {
    pybind11::detail::object_api<pybind11::handle>::attr
              (&local_108,(object_api<pybind11::handle> *)&base_local,"__dict__");
    local_109 = 1;
    local_1ba = pybind11::detail::
                object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>
                ::contains<char_const*&>
                          ((object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>
                            *)&local_108,(char **)((long)&full_name.field_2 + 8));
  }
  if ((local_109 & 1) != 0) {
    pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_108)
    ;
  }
  uVar2 = full_name.field_2._8_8_;
  if (local_1ba != false) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_170,(char *)uVar2,&local_171);
    std::operator+(&local_150,
                   "Error during initialization: multiple incompatible definitions with name \"",
                   &local_170);
    std::operator+(&local_130,&local_150,"\"");
    pybind11_fail(&local_130);
  }
  pybind11::detail::object_api<pybind11::handle>::attr
            (&local_198,(object_api<pybind11::handle> *)&base_local,(char *)full_name.field_2._8_8_)
  ;
  pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>::operator=
            (&local_198,this);
  pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_198);
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

exception(handle scope, const char *name, handle base = PyExc_Exception) {
        std::string full_name = scope.attr("__name__").cast<std::string>() +
                                std::string(".") + name;
        m_ptr = PyErr_NewException(const_cast<char *>(full_name.c_str()), base.ptr(), NULL);
        if (hasattr(scope, "__dict__") && scope.attr("__dict__").contains(name))
            pybind11_fail("Error during initialization: multiple incompatible "
                          "definitions with name \"" + std::string(name) + "\"");
        scope.attr(name) = *this;
    }